

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O1

void __thiscall
gpu::ConvolutionFilters<unsigned_char>::applyConvolution
          (ConvolutionFilters<unsigned_char> *this,uchar *inputBuffer,uchar *outputBuffer,
          int *kernel,int imageWidth,int imageHeight,int kernelSize,int normal,int offset,
          int channel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar2 = 0;
  iVar5 = 0;
  if (kernelSize != 0) {
    iVar4 = offset + ~imageWidth * (kernelSize / 2) + -1;
    uVar6 = 0;
    iVar3 = 1;
    iVar5 = 0;
    iVar2 = 0;
    do {
      bVar7 = iVar3 == kernelSize;
      iVar3 = iVar3 + 1;
      iVar1 = 1;
      if (bVar7) {
        iVar3 = 2;
        iVar1 = imageWidth - kernelSize;
      }
      iVar4 = iVar1 + iVar4;
      if ((channel * imageWidth * imageHeight < iVar4) &&
         (iVar4 < (channel * imageWidth + imageWidth) * imageHeight)) {
        iVar2 = iVar2 + (uint)inputBuffer[iVar4] * kernel[uVar6];
        iVar5 = iVar5 + kernel[uVar6];
      }
      uVar6 = uVar6 + 1;
    } while (kernelSize * kernelSize + (uint)(kernelSize * kernelSize == 0) != uVar6);
  }
  iVar2 = iVar2 / (int)(iVar5 + (uint)(iVar5 == 0));
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  outputBuffer[offset] = (uchar)iVar5;
  return;
}

Assistant:

FUNCTION_PREFIX void ConvolutionFilters<T>::applyConvolution(T* inputBuffer, 
                                                                 T* outputBuffer,
                                                                 int* kernel,
                                                                 int imageWidth,
                                                                 int imageHeight,
                                                                 int kernelSize,
                                                                 int normal,
                                                                 int offset,
                                                                 int channel)
    {
      int startingOffset=offset-(imageWidth*(kernelSize/2))-kernelSize/2;
      int boundaryBase  =channel*imageWidth*imageHeight;
      int boundaryLimit =channel*imageWidth*imageHeight+imageWidth*imageHeight;

      int sum=0;
      int count=0;
      int _offset=startingOffset-1;
      int calc=1;
      for (int c=1;c<=kernelSize*kernelSize;c++)
      {
        if(calc==kernelSize) {_offset+=(imageWidth-kernelSize); calc=1;}
        else _offset+=1;
        if (_offset>boundaryBase && _offset<boundaryLimit)
        {
          sum+=inputBuffer[_offset]*kernel[c-1];
          count+=kernel[c-1];
        }
        calc+=1;
      }
      if (count==0)count=1;
      sum=sum/count;
      PIXEL_DOMAIN_CHECK(sum);
      outputBuffer[offset]=sum;

    }